

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_button_pop_behavior(nk_context *ctx)

{
  int iVar1;
  uint uVar2;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x4e86,"int nk_button_pop_behavior(struct nk_context *)");
  }
  iVar1 = (ctx->stacks).button_behaviors.head;
  if (0 < iVar1) {
    uVar2 = iVar1 - 1;
    (ctx->stacks).button_behaviors.head = uVar2;
    *(ctx->stacks).button_behaviors.elements[uVar2].address =
         (ctx->stacks).button_behaviors.elements[uVar2].old_value;
    return 1;
  }
  __assert_fail("button_stack->head > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x4e8a,"int nk_button_pop_behavior(struct nk_context *)");
}

Assistant:

NK_API int
nk_button_pop_behavior(struct nk_context *ctx)
{
    struct nk_config_stack_button_behavior *button_stack;
    struct nk_config_stack_button_behavior_element *element;

    NK_ASSERT(ctx);
    if (!ctx) return 0;

    button_stack = &ctx->stacks.button_behaviors;
    NK_ASSERT(button_stack->head > 0);
    if (button_stack->head < 1)
        return 0;

    element = &button_stack->elements[--button_stack->head];
    *element->address = element->old_value;
    return 1;
}